

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckEqualFailureBecauseOfExceptionContainsCorrectDetails::
~TestCheckEqualFailureBecauseOfExceptionContainsCorrectDetails
          (TestCheckEqualFailureBecauseOfExceptionContainsCorrectDetails *this)

{
  TestCheckEqualFailureBecauseOfExceptionContainsCorrectDetails *this_local;
  
  ~TestCheckEqualFailureBecauseOfExceptionContainsCorrectDetails(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckEqualFailureBecauseOfExceptionContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails const testDetails("testName", "suiteName", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		CHECK_EQUAL(ThrowingFunction(), 123);    line = __LINE__;
    }

    CHECK_EQUAL("testName", reporter.lastFailedTest);
    CHECK_EQUAL("suiteName", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}